

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_491d53::BuildEngineImpl::scanRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  StateKind SVar1;
  BuildEngineTrace *pBVar2;
  bool bVar3;
  int iVar4;
  RuleScanRecord *pRVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  bool bVar8;
  Rule *pRVar9;
  BuildEngineDelegate *pBVar10;
  value_type local_38;
  
  SVar1 = ruleInfo->state;
  bVar3 = 1 < (int)SVar1;
  if (SVar1 == Complete) {
    bVar3 = this->currentEpoch == (ruleInfo->result).builtAt;
  }
  bVar8 = true;
  if (bVar3) {
    return true;
  }
  if (SVar1 == IsScanning) {
LAB_001b6460:
    bVar8 = false;
  }
  else {
    llbuild::core::DependencyKeyIDs::cleanSingleUseDependencies(&(ruleInfo->result).dependencies);
    pBVar2 = (this->trace)._M_t.
             super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
             .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
    if (pBVar2 != (BuildEngineTrace *)0x0) {
      llbuild::core::BuildEngineTrace::checkingRuleNeedsToRun
                (pBVar2,(ruleInfo->rule)._M_t.
                        super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                        .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
    }
    pRVar9 = (ruleInfo->rule)._M_t.
             super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
             _M_t.
             super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
             .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
    (*pRVar9->_vptr_Rule[4])(pRVar9,this->buildEngine,0);
    ruleInfo->wasForced = false;
    if ((ruleInfo->result).builtAt == 0) {
      pBVar2 = (this->trace)._M_t.
               super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
      if (pBVar2 != (BuildEngineTrace *)0x0) {
        llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseNeverBuilt
                  (pBVar2,(ruleInfo->rule)._M_t.
                          super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                          .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
      }
      ruleInfo->state = NeedsToRun;
      pBVar10 = this->delegate;
      pRVar9 = (ruleInfo->rule)._M_t.
               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      pp_Var6 = pBVar10->_vptr_BuildEngineDelegate;
      uVar7 = 0;
    }
    else {
      pRVar9 = (ruleInfo->rule)._M_t.
               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      if ((pRVar9->signature).value == (ruleInfo->result).signature.value) {
        iVar4 = (*pRVar9->_vptr_Rule[3])(pRVar9,this->buildEngine,&ruleInfo->result);
        if ((char)iVar4 != '\0') {
          pBVar2 = (this->trace)._M_t.
                   super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                   .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
          if ((ruleInfo->result).dependencies.keys.
              super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (ruleInfo->result).dependencies.keys.
              super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            if (pBVar2 != (BuildEngineTrace *)0x0) {
              llbuild::core::BuildEngineTrace::ruleDoesNotNeedToRun
                        (pBVar2,(ruleInfo->rule)._M_t.
                                super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                                .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
            }
            ruleInfo->state = DoesNotNeedToRun;
            return true;
          }
          if (pBVar2 != (BuildEngineTrace *)0x0) {
            llbuild::core::BuildEngineTrace::ruleScheduledForScanning
                      (pBVar2,(ruleInfo->rule)._M_t.
                              super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                              .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
          }
          ruleInfo->state = IsScanning;
          pRVar5 = newRuleScanRecord(this);
          (ruleInfo->inProgressInfo).pendingScanRecord = pRVar5;
          local_38.inputIndex = 0;
          local_38.inputRuleInfo = (RuleInfo *)0x0;
          local_38.orderOnly = false;
          local_38.singleUse = false;
          local_38.ruleInfo = ruleInfo;
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ::push_back(&this->ruleInfosToScan,&local_38);
          goto LAB_001b6460;
        }
        pBVar2 = (this->trace)._M_t.
                 super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
        if (pBVar2 != (BuildEngineTrace *)0x0) {
          llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseInvalidValue
                    (pBVar2,(ruleInfo->rule)._M_t.
                            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
        }
        ruleInfo->state = NeedsToRun;
        pBVar10 = this->delegate;
        pRVar9 = (ruleInfo->rule)._M_t.
                 super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                 .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
        pp_Var6 = pBVar10->_vptr_BuildEngineDelegate;
        uVar7 = 2;
      }
      else {
        pBVar2 = (this->trace)._M_t.
                 super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
        if (pBVar2 != (BuildEngineTrace *)0x0) {
          llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseSignatureChanged(pBVar2,pRVar9);
          pRVar9 = (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
        }
        ruleInfo->state = NeedsToRun;
        pBVar10 = this->delegate;
        pp_Var6 = pBVar10->_vptr_BuildEngineDelegate;
        uVar7 = 1;
      }
    }
    (*pp_Var6[4])(pBVar10,pRVar9,uVar7,0);
  }
  return bVar8;
}

Assistant:

bool scanRule(RuleInfo& ruleInfo) {
    // If the rule is already scanned, we are done.
    if (ruleInfo.isScanned(this))
      return true;

    // If the rule is being scanned, we don't need to do anything.
    if (ruleInfo.isScanning())
      return false;
    
    /// Cleans up single use dependencies that should not be considered for incremental builds.
    ruleInfo.result.dependencies.cleanSingleUseDependencies();

    // Otherwise, start scanning the rule.
    if (trace)
      trace->checkingRuleNeedsToRun(ruleInfo.rule.get());

    // Report the status change.
    ruleInfo.rule->updateStatus(buildEngine, Rule::StatusKind::IsScanning);

    ruleInfo.wasForced = false;

    // If the rule has never been run, it needs to run.
    if (ruleInfo.result.builtAt == 0) {
      if (trace)
        trace->ruleNeedsToRunBecauseNeverBuilt(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::NeverBuilt, nullptr);
      return true;
    }

    if (ruleInfo.rule->signature != ruleInfo.result.signature) {
      if (trace)
        trace->ruleNeedsToRunBecauseSignatureChanged(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::SignatureChanged, nullptr);
      return true;
    }

    // If the rule indicates its computed value is out of date, it needs to run.
    //
    // FIXME: We should probably try and move this so that it can be done by
    // clients in the background, either by us backgrounding it, or by using a
    // completion model as we do for inputs.
    if (!ruleInfo.rule->isResultValid(buildEngine, ruleInfo.result.value)) {
      if (trace)
        trace->ruleNeedsToRunBecauseInvalidValue(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::InvalidValue, nullptr);
      return true;
    }

    // If the rule has no dependencies, then it is ready to run.
    if (ruleInfo.result.dependencies.empty()) {
      if (trace)
        trace->ruleDoesNotNeedToRun(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::DoesNotNeedToRun;
      return true;
    }

    // Otherwise, we need to do a recursive scan of the inputs so enqueue this
    // rule for scanning.
    //
    // We could also take an approach where we enqueue each of the individual
    // inputs, but in my experiments with that approach it has always performed
    // significantly worse.
    if (trace)
      trace->ruleScheduledForScanning(ruleInfo.rule.get());
    ruleInfo.state = RuleInfo::StateKind::IsScanning;
    ruleInfo.setPendingScanRecord(newRuleScanRecord());
    ruleInfosToScan.push_back({ &ruleInfo, /*InputIndex=*/0, nullptr, false });

    return false;
  }